

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int writeJournalHdr(Pager *pPager)

{
  uchar (*__s) [8];
  uint uVar1;
  i64 iVar2;
  bool bVar3;
  int local_2c;
  uint local_28;
  int ii;
  u32 nWrite;
  u32 nHeader;
  char *zHeader;
  int rc;
  Pager *pPager_local;
  
  zHeader._4_4_ = 0;
  __s = (uchar (*) [8])pPager->pTmpSpace;
  ii = pPager->pageSize;
  if (pPager->sectorSize < (uint)ii) {
    ii = pPager->sectorSize;
  }
  for (local_2c = 0; local_2c < pPager->nSavepoint; local_2c = local_2c + 1) {
    if (pPager->aSavepoint[local_2c].iHdrOffset == 0) {
      pPager->aSavepoint[local_2c].iHdrOffset = pPager->journalOff;
    }
  }
  iVar2 = journalHdrOffset(pPager);
  pPager->journalOff = iVar2;
  pPager->journalHdr = iVar2;
  if ((pPager->noSync == '\0') && (pPager->journalMode != '\x04')) {
    uVar1 = sqlite3OsDeviceCharacteristics(pPager->fd);
    if ((uVar1 & 0x200) == 0) {
      memset(__s,0,0xc);
      goto LAB_001430b6;
    }
  }
  *__s = (uchar  [8])0xd763a120f905d5d9;
  sqlite3Put4byte(__s[1],0xffffffff);
LAB_001430b6:
  sqlite3_randomness(4,&pPager->cksumInit);
  sqlite3Put4byte(__s[1] + 4,pPager->cksumInit);
  sqlite3Put4byte(__s[2],pPager->dbOrigSize);
  sqlite3Put4byte(__s[2] + 4,pPager->sectorSize);
  sqlite3Put4byte(__s[3],pPager->pageSize);
  memset(__s[3] + 4,0,(ulong)(uint)ii - 0x1c);
  local_28 = 0;
  while( true ) {
    bVar3 = false;
    if (zHeader._4_4_ == 0) {
      bVar3 = local_28 < pPager->sectorSize;
    }
    if (!bVar3) break;
    zHeader._4_4_ = sqlite3OsWrite(pPager->jfd,__s,ii,pPager->journalOff);
    pPager->journalOff = (ulong)(uint)ii + pPager->journalOff;
    local_28 = ii + local_28;
  }
  return zHeader._4_4_;
}

Assistant:

static int writeJournalHdr(Pager *pPager){
  int rc = SQLITE_OK;                 /* Return code */
  char *zHeader = pPager->pTmpSpace;  /* Temporary space used to build header */
  u32 nHeader = (u32)pPager->pageSize;/* Size of buffer pointed to by zHeader */
  u32 nWrite;                         /* Bytes of header sector written */
  int ii;                             /* Loop counter */

  assert( isOpen(pPager->jfd) );      /* Journal file must be open. */

  if( nHeader>JOURNAL_HDR_SZ(pPager) ){
    nHeader = JOURNAL_HDR_SZ(pPager);
  }

  /* If there are active savepoints and any of them were created 
  ** since the most recent journal header was written, update the 
  ** PagerSavepoint.iHdrOffset fields now.
  */
  for(ii=0; ii<pPager->nSavepoint; ii++){
    if( pPager->aSavepoint[ii].iHdrOffset==0 ){
      pPager->aSavepoint[ii].iHdrOffset = pPager->journalOff;
    }
  }

  pPager->journalHdr = pPager->journalOff = journalHdrOffset(pPager);

  /* 
  ** Write the nRec Field - the number of page records that follow this
  ** journal header. Normally, zero is written to this value at this time.
  ** After the records are added to the journal (and the journal synced, 
  ** if in full-sync mode), the zero is overwritten with the true number
  ** of records (see syncJournal()).
  **
  ** A faster alternative is to write 0xFFFFFFFF to the nRec field. When
  ** reading the journal this value tells SQLite to assume that the
  ** rest of the journal file contains valid page records. This assumption
  ** is dangerous, as if a failure occurred whilst writing to the journal
  ** file it may contain some garbage data. There are two scenarios
  ** where this risk can be ignored:
  **
  **   * When the pager is in no-sync mode. Corruption can follow a
  **     power failure in this case anyway.
  **
  **   * When the SQLITE_IOCAP_SAFE_APPEND flag is set. This guarantees
  **     that garbage data is never appended to the journal file.
  */
  assert( isOpen(pPager->fd) || pPager->noSync );
  if( pPager->noSync || (pPager->journalMode==PAGER_JOURNALMODE_MEMORY)
   || (sqlite3OsDeviceCharacteristics(pPager->fd)&SQLITE_IOCAP_SAFE_APPEND) 
  ){
    memcpy(zHeader, aJournalMagic, sizeof(aJournalMagic));
    put32bits(&zHeader[sizeof(aJournalMagic)], 0xffffffff);
  }else{
    memset(zHeader, 0, sizeof(aJournalMagic)+4);
  }

  /* The random check-hash initializer */ 
  sqlite3_randomness(sizeof(pPager->cksumInit), &pPager->cksumInit);
  put32bits(&zHeader[sizeof(aJournalMagic)+4], pPager->cksumInit);
  /* The initial database size */
  put32bits(&zHeader[sizeof(aJournalMagic)+8], pPager->dbOrigSize);
  /* The assumed sector size for this process */
  put32bits(&zHeader[sizeof(aJournalMagic)+12], pPager->sectorSize);

  /* The page size */
  put32bits(&zHeader[sizeof(aJournalMagic)+16], pPager->pageSize);

  /* Initializing the tail of the buffer is not necessary.  Everything
  ** works find if the following memset() is omitted.  But initializing
  ** the memory prevents valgrind from complaining, so we are willing to
  ** take the performance hit.
  */
  memset(&zHeader[sizeof(aJournalMagic)+20], 0,
         nHeader-(sizeof(aJournalMagic)+20));

  /* In theory, it is only necessary to write the 28 bytes that the 
  ** journal header consumes to the journal file here. Then increment the 
  ** Pager.journalOff variable by JOURNAL_HDR_SZ so that the next 
  ** record is written to the following sector (leaving a gap in the file
  ** that will be implicitly filled in by the OS).
  **
  ** However it has been discovered that on some systems this pattern can 
  ** be significantly slower than contiguously writing data to the file,
  ** even if that means explicitly writing data to the block of 
  ** (JOURNAL_HDR_SZ - 28) bytes that will not be used. So that is what
  ** is done. 
  **
  ** The loop is required here in case the sector-size is larger than the 
  ** database page size. Since the zHeader buffer is only Pager.pageSize
  ** bytes in size, more than one call to sqlite3OsWrite() may be required
  ** to populate the entire journal header sector.
  */ 
  for(nWrite=0; rc==SQLITE_OK&&nWrite<JOURNAL_HDR_SZ(pPager); nWrite+=nHeader){
    IOTRACE(("JHDR %p %lld %d\n", pPager, pPager->journalHdr, nHeader))
    rc = sqlite3OsWrite(pPager->jfd, zHeader, nHeader, pPager->journalOff);
    assert( pPager->journalHdr <= pPager->journalOff );
    pPager->journalOff += nHeader;
  }

  return rc;
}